

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O3

bool Cipher::doSimulatedAnnealing5
               (TParameters *params,TFreqMap *freqMap,TSimilarityMap *ccMap,TClusters *clusters,
               TClusterToLetterMap *clMap)

{
  mapped_type mVar1;
  int cid;
  key_type_conflict kVar2;
  TClusterToLetterMap *pTVar3;
  int iVar4;
  mapped_type_conflict *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  pointer piVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  TProb TVar22;
  int i2;
  int ii;
  int i3;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> fixed;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> used;
  key_type_conflict local_fc;
  key_type_conflict local_f8;
  float local_f4;
  float local_f0;
  int local_ec;
  TClusterToLetterMap *local_e8;
  float local_dc;
  double local_d8;
  float local_d0;
  float local_cc;
  int local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  ulong local_b8;
  TFreqMap *local_b0;
  TSimilarityMap *local_a8;
  long local_a0;
  ulong local_98;
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  local_60;
  
  local_98 = (ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if ((int)(uint)local_98 < 1) {
    dVar21 = NAN;
  }
  else {
    uVar8 = (ulong)((uint)local_98 & 0x7fffffff);
    lVar10 = -uVar8;
    fVar18 = 0.0;
    lVar13 = 0x10;
    iVar15 = 0;
    uVar12 = 0;
    do {
      lVar10 = lVar10 + 1;
      uVar14 = uVar12 + 1;
      if (uVar14 < uVar8) {
        pdVar16 = (double *)
                  (*(long *)&(ccMap->
                             super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar12].
                             super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                             super__Vector_impl_data + lVar13);
        lVar17 = 0;
        do {
          fVar18 = (float)((double)fVar18 + *pdVar16);
          pdVar16 = pdVar16 + 2;
          lVar17 = lVar17 + -1;
        } while (lVar10 != lVar17);
        iVar15 = iVar15 - (int)lVar17;
      }
      lVar13 = lVar13 + 0x10;
      uVar12 = uVar14;
    } while (uVar14 != uVar8);
    dVar21 = (double)(fVar18 / (float)iVar15);
  }
  local_b0 = freqMap;
  local_a8 = ccMap;
  printf("Average cc = %g\n",dVar21);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&clMap->_M_t);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar9 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_e8 = clMap;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar9) >> 2)) {
    lVar13 = 0;
    lVar10 = 0;
    do {
      if (-1 < *(int *)((long)piVar9 + lVar13)) {
        pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)&local_90,
                            (key_type_conflict *)
                            ((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + lVar13));
        piVar9 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*pmVar5 == false) {
          mVar1 = *(mapped_type *)((long)piVar9 + lVar13);
          pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](local_e8,(key_type_conflict *)
                                       ((long)(clusters->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_start + lVar13));
          *pmVar6 = mVar1;
          pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_60,
                                (key_type_conflict *)
                                ((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar13));
          *pmVar5 = true;
          pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_90,
                                (key_type_conflict *)
                                ((long)(clusters->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start + lVar13));
          *pmVar5 = true;
          printf("Fixed %d\n",
                 (ulong)*(uint *)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar13));
          piVar9 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
      }
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 4;
    } while (lVar10 < (int)((ulong)((long)(params->hint).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar9) >> 2));
  }
  local_f8 = 0;
  local_fc = 0;
  if (0 < params->maxClusters) {
    do {
      pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                           *)&local_90,&local_fc);
      if (*pmVar5 == false) {
        do {
          pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_60,&local_f8);
          kVar2 = local_f8;
          local_f8 = local_f8 + 1;
        } while (*pmVar5 != false);
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_e8,&local_fc);
        *pmVar6 = kVar2;
      }
      local_fc = local_fc + 1;
    } while (local_fc < params->maxClusters);
  }
  local_f0 = params->temp0;
  local_c4 = params->wLanguageModel;
  local_f4 = costF(local_a8,clusters);
  local_d8 = calcScore0(params,local_b0,clusters,local_e8);
  local_a0 = std::chrono::_V2::system_clock::now();
  if (0 < params->saMaxIterations) {
    fVar18 = local_c4 * (float)local_d8 + local_f4;
    uVar12 = 0;
    local_c8 = 0;
    local_dc = (float)local_d8;
    local_bc = fVar18;
    do {
      iVar15 = (int)uVar12;
      local_d8 = (double)CONCAT44(local_d8._4_4_,fVar18);
      if ((iVar15 * 0x3afb7e91 + 0x346dc0U >> 4 | iVar15 * 0x10000000) < 0x68db9) {
        lVar10 = std::chrono::_V2::system_clock::now();
        printf("Speed: %6.2f iter/ms, Iter %5d : temp = %16.4f, cost0 = %8.4f, costCL = %8.4f, costLM = %8.4f\n"
               ,(double)((float)iVar15 / (float)((lVar10 - local_a0) / 1000000)),(double)local_f0,
               (double)local_d8._0_4_,(double)local_f4,(double)local_dc,uVar12);
        piVar9 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar9) >> 2))
        {
          lVar10 = 0;
          lVar13 = 0;
          do {
            pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](local_e8,(key_type_conflict *)((long)piVar9 + lVar10));
            putchar(*pmVar6 + 0x60);
            lVar13 = lVar13 + 1;
            piVar9 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar10 = lVar10 + 4;
          } while (lVar13 < (int)((ulong)((long)(clusters->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)piVar9) >> 2));
        }
        putchar(10);
        fVar18 = local_d8._0_4_;
      }
      if ((local_bc != fVar18) || (NAN(local_bc) || NAN(fVar18))) {
        local_c8 = 0;
        local_bc = fVar18;
      }
      else {
        local_c8 = local_c8 + 1;
        dVar21 = (double)params->saMaxIterations * 0.01;
        if ((dVar21 == (double)local_c8) && (!NAN(dVar21) && !NAN((double)local_c8))) {
          puts("No improvement for long time. Aborting");
          uVar12 = (ulong)(params->saMaxIterations + 1);
        }
      }
      local_b8 = uVar12;
      iVar15 = rand();
      local_f8 = rand();
      local_f8 = local_f8 % params->maxClusters;
      local_fc = rand();
      local_fc = local_fc % params->maxClusters;
      local_ec = rand();
      uVar12 = local_98;
      local_ec = local_ec % params->maxClusters;
      while( true ) {
        iVar15 = iVar15 % (int)uVar12;
        if ((params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar15] < 0) break;
        iVar15 = rand();
      }
      cid = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar15];
      do {
        iVar4 = rand();
        iVar4 = iVar4 % params->maxClusters;
        (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar15] = iVar4;
      } while (cid == iVar4);
      fVar18 = costFUpdate(local_a8,clusters,iVar15,cid,local_f4);
      local_c0 = local_c4 * local_dc + fVar18;
      if (local_c0 - local_d8._0_4_ <= 0.0) {
        local_cc = fVar18;
        local_d0 = expf(((local_c0 - local_d8._0_4_) / local_f0) * 0.01);
        fVar19 = frand();
        fVar18 = local_cc;
        if (local_d0 <= fVar19) {
          (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar15] = cid;
          local_c0 = local_d8._0_4_;
          fVar18 = local_f4;
        }
      }
      pTVar3 = local_e8;
      local_f4 = fVar18;
      while (((local_fc == local_ec ||
              (pmVar5 = std::
                        map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                        ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                      *)&local_90,&local_fc), *pmVar5 != false)) ||
             (pmVar5 = std::
                       map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                     *)&local_90,&local_ec), *pmVar5 == true))) {
        local_fc = rand();
        local_fc = local_fc % params->maxClusters;
        local_ec = rand();
        local_ec = local_ec % params->maxClusters;
      }
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pTVar3,&local_fc);
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pTVar3,&local_ec);
      mVar1 = *pmVar6;
      *pmVar6 = *pmVar7;
      *pmVar7 = mVar1;
      while (pmVar5 = std::
                      map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                      operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                  *)&local_90,&local_f8), *pmVar5 == true) {
        local_f8 = rand();
        local_f8 = local_f8 % params->maxClusters;
      }
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pTVar3,&local_f8);
      mVar1 = *pmVar6;
      do {
        iVar15 = rand();
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_e8,&local_f8);
        pTVar3 = local_e8;
      } while (*pmVar6 == iVar15 % 0x1b);
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](local_e8,&local_f8);
      *pmVar6 = iVar15 % 0x1b;
      TVar22 = calcScore0(params,local_b0,clusters,pTVar3);
      fVar19 = (float)TVar22;
      fVar18 = local_c4 * fVar19 + local_f4;
      if (fVar18 - local_c0 <= 0.0) {
        local_d8 = (double)CONCAT44(local_d8._4_4_,fVar18);
        local_cc = fVar19;
        local_d0 = expf(((fVar18 - local_c0) / local_f0) * 0.01);
        fVar20 = frand();
        fVar18 = local_d8._0_4_;
        fVar19 = local_cc;
        if (local_d0 <= fVar20) {
          pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](local_e8,&local_f8);
          *pmVar6 = mVar1;
          pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](local_e8,&local_fc);
          pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](local_e8,&local_ec);
          mVar1 = *pmVar6;
          *pmVar6 = *pmVar7;
          *pmVar7 = mVar1;
          fVar18 = local_c0;
          fVar19 = local_dc;
        }
      }
      local_f0 = local_f0 * params->coolingRate;
      uVar11 = (int)local_b8 + 1;
      uVar12 = (ulong)uVar11;
      local_dc = fVar19;
    } while ((int)uVar11 < params->saMaxIterations);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&local_60);
  return true;
}

Assistant:

bool doSimulatedAnnealing5(
        const TParameters & params,
        const TFreqMap & freqMap,
        const TSimilarityMap & ccMap,
        TClusters & clusters,
        TClusterToLetterMap & clMap
        ) {

        int n = clusters.size();

        int ncc = 0;
        float ccavg = 0.0;
        for (int j = 0; j < n; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccavg += ccMap[j][i].cc;
                ++ncc;
            }
        }
        ccavg /= ncc;
        printf("Average cc = %g\n", ccavg);

        clMap.clear();
        std::map<TLetter, bool> used;
        std::map<TClusterId, bool> fixed;
        for (int i = 0; i < (int) params.hint.size(); ++i) {
            if (params.hint[i] < 0) continue;
            //if (used[params.hint[i]]) continue;
            if (fixed[clusters[i]]) continue;

            clMap[clusters[i]] = params.hint[i];
            used[params.hint[i]] = true;
            fixed[clusters[i]] = true;
            printf("Fixed %d\n", clusters[i]);
        }

        {
            int ii = 0;
            for (int i = 0; i < params.maxClusters; ++i) {
                if (fixed[i]) continue;
                while (used[ii]) ++ii;
                clMap[i] = ii++;
            }
        }

        float wlm = params.wLanguageModel;
        float temp = params.temp0;
        float cost0CL = costF(ccMap, clusters);
        float cost0LM = calcScore0(params, freqMap, clusters, clMap);
        float cost0 = cost0CL + wlm*cost0LM;

        int nRepeat = 0;
        float costOld = cost0;

        auto tStart = std::chrono::high_resolution_clock::now();

        for (int iter = 0; iter < params.saMaxIterations; ++iter) {
            if (iter%10000 == 0) {
                auto tEnd = std::chrono::high_resolution_clock::now();
                float iterPerT = (float)(iter)/((float)(std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count()));

                printf("Speed: %6.2f iter/ms, Iter %5d : temp = %16.4f, cost0 = %8.4f, costCL = %8.4f, costLM = %8.4f\n",
                       iterPerT, iter, temp, cost0, cost0CL, cost0LM);
                for (int i = 0; i < (int) clusters.size(); ++i) { printf("%c", 'a'+clMap[clusters[i]]-1); }
                printf("\n");
            }

            if (costOld == cost0) {
                //if (++nRepeat == 0.005*params.saMaxIterations) {
                //    printf("Heating\n");
                //    temp *= 100.1f;
                //}
                if (++nRepeat == 0.01*params.saMaxIterations) {
                    printf("No improvement for long time. Aborting\n");
                    iter = params.saMaxIterations + 1;
                }
            } else {
                nRepeat = 0;
                costOld = cost0;
            }

            int cid = -1;
            int i1l = -1;
            int i = rand()%n;
            int i1 = rand()%params.maxClusters;
            int i2 = rand()%params.maxClusters;
            int i3 = rand()%params.maxClusters;

            float costCurCL = cost0CL;
            float costCurLM = cost0LM;

            {
                while (params.hint[i] >= 0) {
                    i = rand()%n;
                }

                cid = clusters[i];
                while (cid == clusters[i]) {
                    clusters[i] = rand()%params.maxClusters;
                }

                costCurCL = costFUpdate(ccMap, clusters, i, cid, cost0CL);

                float cost1 = costCurCL + wlm*cost0LM;
                float delta = cost1 - cost0;
                if (delta > 0 || (std::exp(0.01f*(delta/temp)) > frand())) {
                    cost0CL = costCurCL;
                    cost0 = cost1;
                } else {
                    clusters[i] = cid;
                }
            }

            {
                while (i2 == i3 || fixed[i2] || fixed[i3]) {
                    i2 = rand()%params.maxClusters;
                    i3 = rand()%params.maxClusters;
                }
                std::swap(clMap[i2], clMap[i3]);

                while (fixed[i1]) {
                    i1 = rand()%params.maxClusters;
                }
                i1l = clMap[i1];
                int letterNew = rand()%27;
                while (clMap[i1] == letterNew) {
                    letterNew = rand()%27;
                }

                clMap[i1] = letterNew;

                costCurLM = calcScore0(params, freqMap, clusters, clMap);

                float cost1 = cost0CL + wlm*costCurLM;
                float delta = cost1 - cost0;
                if (delta > 0 || (std::exp(0.01f*(delta/temp)) > frand())) {
                    cost0LM = costCurLM;
                    cost0 = cost1;
                } else {
                    clMap[i1] = i1l;
                    std::swap(clMap[i2], clMap[i3]);
                }
            }

            temp *= params.coolingRate;
        }

        return true;
    }